

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_util.c
# Opt level: O2

int struplocompare(char *p1,char *p2)

{
  int iVar1;
  
  if (p1 == (char *)0x0) {
    return -(uint)(p2 != (char *)0x0);
  }
  if (p2 == (char *)0x0) {
    return 1;
  }
  iVar1 = strcasecmp(p1,p2);
  return iVar1;
}

Assistant:

int struplocompare(const char *p1, const char *p2)
{
  if(!p1)
    return p2? -1: 0;
  if(!p2)
    return 1;
#ifdef HAVE_STRCASECMP
  return strcasecmp(p1, p2);
#elif defined(HAVE_STRCMPI)
  return strcmpi(p1, p2);
#elif defined(HAVE_STRICMP)
  return stricmp(p1, p2);
#else
  return strcmp(p1, p2);
#endif
}